

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall
NLReaderTest_WriteBinaryHeader_Test::TestBody(NLReaderTest_WriteBinaryHeader_Test *this)

{
  undefined1 uVar1;
  AssertionResult gtest_ar;
  MemoryWriter w;
  int i;
  NLHeader header;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  allocator<char> *expected;
  char *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  Type in_stack_fffffffffffffc7c;
  AssertHelper *in_stack_fffffffffffffc80;
  BasicWriter<char> *in_stack_fffffffffffffc88;
  AssertionResult local_370 [2];
  allocator<char> local_349 [17];
  Message *in_stack_fffffffffffffcc8;
  AssertHelper *in_stack_fffffffffffffcd0;
  NLHeader *in_stack_fffffffffffffd28;
  Writer *in_stack_fffffffffffffd30;
  int local_11c;
  undefined1 local_118 [168];
  undefined4 local_70;
  undefined4 local_6c;
  long alStack_68 [11];
  undefined4 local_10;
  
  memset(local_118,0,0x110);
  mp::NLHeader::NLHeader((NLHeader *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
  local_70 = 1;
  local_6c = 3;
  for (local_11c = 0; local_11c < 3; local_11c = local_11c + 1) {
    alStack_68[local_11c] = (long)((local_11c + 1) * 0xb);
  }
  local_10 = 5;
  expected = local_349;
  std::allocator<char>::allocator();
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
            (in_stack_fffffffffffffc70,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  std::allocator<char>::~allocator(local_349);
  mp::operator<<(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  fmt::BasicWriter<char>::str_abi_cxx11_(in_stack_fffffffffffffc88);
  testing::internal::EqHelper<false>::Compare<char[92],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
             in_stack_fffffffffffffc60,(char (*) [92])expected,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc70);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(local_370);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc80);
    testing::AssertionResult::failure_message((AssertionResult *)0x149e63);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,(char *)in_stack_fffffffffffffc70
               ,in_stack_fffffffffffffc6c,in_stack_fffffffffffffc60);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_fffffffffffffc50));
    testing::Message::~Message((Message *)0x149eaf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x149eef);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter
            ((BasicMemoryWriter<char,_std::allocator<char>_> *)
             CONCAT17(uVar1,in_stack_fffffffffffffc50));
  return;
}

Assistant:

TEST(NLReaderTest, WriteBinaryHeader) {
  NLHeader header = NLHeader();
  header.format = NLHeader::BINARY;
  header.num_ampl_options = 3;
  for (int i = 0; i < header.num_ampl_options; ++i)
    header.ampl_options[i] = 11 * (i + 1);
  header.arith_kind = (NLArithKind)mp::arith::CRAY;
  fmt::MemoryWriter w;
  w << header;
  EXPECT_EQ(
      "b3 11 22 33\n"
      " 0 0 0 0 0 0\n"
      " 0 0 0 0 0 0\n"
      " 0 0\n"
      " 0 0 0\n"
      " 0 0 5 0\n"
      " 0 0 0 0 0\n"
      " 0 0\n"
      " 0 0\n"
      " 0 0 0 0 0\n",
      w.str());
}